

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetFullNameImported
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool implib)

{
  string local_48;
  undefined1 local_21;
  string *psStack_20;
  bool implib_local;
  string *config_local;
  cmTarget *this_local;
  
  local_21 = implib;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmTarget *)__return_storage_ptr__;
  ImportedGetFullPath(&local_48,this,config,implib);
  cmsys::SystemTools::GetFilenameName(__return_storage_ptr__,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmTarget::GetFullNameImported(const std::string& config, bool implib) const
{
  return cmSystemTools::GetFilenameName(
    this->ImportedGetFullPath(config, implib));
}